

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool testConn(void)

{
  int iVar1;
  uint64_t timestamp;
  ssize_t sVar2;
  socklen_t __len;
  size_t __n;
  sockaddr *__addr;
  C *pCVar3;
  int in_R8D;
  Socket socket;
  in_addr addr2;
  SockAddr addr;
  Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> local_bc;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_b8;
  in_addr local_8c;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_88;
  sockaddr local_68;
  undefined4 uStack_58;
  undefined8 uStack_54;
  Time local_44;
  
  uStack_58 = 0;
  uStack_54 = 0;
  local_68.sa_family = 0;
  local_68.sa_data[0] = '\0';
  local_68.sa_data[1] = '\0';
  local_68.sa_data[2] = '\0';
  local_68.sa_data[3] = '\0';
  local_68.sa_data[4] = '\0';
  local_68.sa_data[5] = '\0';
  local_68.sa_data[6] = '\0';
  local_68.sa_data[7] = '\0';
  local_68.sa_data[8] = '\0';
  local_68.sa_data[9] = '\0';
  local_68.sa_data[10] = '\0';
  local_68.sa_data[0xb] = '\0';
  local_68.sa_data[0xc] = '\0';
  local_68.sa_data[0xd] = '\0';
  local_b8.m_length._0_1_ = 0;
  local_b8.m_length._1_7_ = 0;
  local_b8.m_isNullTerminated = false;
  local_b8.m_p = (C *)0x0;
  local_b8.m_hdr._0_1_ = 0;
  local_b8.m_hdr._1_7_ = 0;
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
            (&local_b8,(BufHdr *)0x0);
  local_b8.m_p = "192.168.1.73:1002";
  local_b8.m_length._0_1_ = 0x11;
  local_b8.m_length._1_7_ = 0;
  local_b8.m_isNullTerminated = true;
  axl::io::parseSockAddr(&local_68,0x1c,&local_b8);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_b8);
  local_b8.m_length._0_1_ = 0;
  local_b8.m_length._1_7_ = 0;
  local_b8.m_isNullTerminated = false;
  local_b8.m_p = (C *)0x0;
  local_b8.m_hdr._0_1_ = 0;
  local_b8.m_hdr._1_7_ = 0;
  axl::io::parseAddr_ip4(&local_8c,&local_b8);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_b8);
  local_b8.m_length._0_1_ = 0;
  local_b8.m_length._1_7_ = 0;
  local_b8.m_isNullTerminated = false;
  local_b8.m_p = (C *)0x0;
  local_b8.m_hdr._0_1_ = 0;
  local_b8.m_hdr._1_7_ = 0;
  axl::io::getSockAddrString((String *)&local_b8,&local_68);
  pCVar3 = local_b8.m_p;
  if (CONCAT71(local_b8.m_length._1_7_,(undefined1)local_b8.m_length) == 0) {
    pCVar3 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  printf("connecting to %s...\n",pCVar3);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_b8);
  local_bc.m_h = -1;
  __len = 6;
  iVar1 = axl::io::psx::Socket::open((Socket *)&local_bc,(char *)0x2,1);
  if (((char)iVar1 != '\0') &&
     (iVar1 = axl::io::psx::Socket::connect((Socket *)&local_bc,(int)&local_68,__addr,__len),
     (char)iVar1 != '\0')) {
    do {
      timestamp = axl::sys::getTimestamp();
      __n = 0;
      axl::sys::Time::setTimestampImpl(&local_44,timestamp,true,0);
      local_88.m_length._0_1_ = 0;
      local_88.m_length._1_7_ = 0;
      local_88.m_isNullTerminated = false;
      local_88.m_p = (C *)0x0;
      local_88.m_hdr._0_1_ = 0;
      local_88.m_hdr._1_7_ = 0;
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
                (&local_88,(BufHdr *)0x0);
      local_88.m_p = "%h:%m:%s";
      local_88.m_length._0_1_ = 8;
      local_88.m_length._1_7_ = 0;
      local_88.m_isNullTerminated = true;
      axl::sys::Time::format((String *)&local_b8,&local_44,&local_88);
      pCVar3 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
      if (CONCAT71(local_b8.m_length._1_7_,(undefined1)local_b8.m_length) != 0) {
        pCVar3 = local_b8.m_p;
      }
      printf("%s: sending %d bytes...",pCVar3,0x14);
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_b8);
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_88);
      sVar2 = axl::io::psx::Socket::send((Socket *)&local_bc,0x19f960,(void *)0x14,__n,in_R8D);
      printf("%d bytes sent\n",sVar2);
      axl::sys::sleep(5000);
    } while( true );
  }
  axl::err::getLastErrorDescription();
  pCVar3 = local_b8.m_p;
  if (CONCAT71(local_b8.m_length._1_7_,(undefined1)local_b8.m_length) == 0) {
    pCVar3 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  printf("failed: %s\n",pCVar3);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_b8);
  axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle(&local_bc);
  return false;
}

Assistant:

void
testNetworkAdapterList() {
	printf("Enumerating adapters...\n");

	sl::List<io::NetworkAdapterDesc> adapterList;
	io::enumerateNetworkAdapters(&adapterList);

	printf("%d adapters found.\n", adapterList.getCount());

	sl::Iterator<io::NetworkAdapterDesc> adapterIt = adapterList.getHead();
	for (; adapterIt; adapterIt++) {
		io::NetworkAdapterDesc* adapter = *adapterIt;

		printf("Name        = %s\n", adapter->m_name.sz());
		printf("Description = %s\n", adapter->m_description.sz());
		printf("Type        = %s\n", io::getNetworkAdapterTypeString(adapter->m_type));
		printf("Flags       = %s\n", io::getNetworkAdapterFlagString(adapter->m_flags).sz());
		printf("Mac         = %s\n", io::getMacAddressString(adapter->m_macAddress).sz());

		sl::ConstList<io::NetworkAdapterAddress> addressList = adapter->m_addressList;
		sl::ConstIterator<io::NetworkAdapterAddress> addressIt = addressList.getHead();
		for (size_t i = 1; addressIt; addressIt++, i++) {
			const io::NetworkAdapterAddress* address = *addressIt;

			uint_t family = address->m_address.m_addr.sa_family;
			printf("%-11s = %s",
				io::getSockAddrFamilyString(family),
				address->m_address.getString().sz()
			);

			if (family == AF_INET) {
				io::SockAddr netMask;
				netMask.createNetMask_ip4(address->m_netMaskBitCount);
				printf(" (mask %s)\n", netMask.getString().sz());
			} else {
				printf("/%d\n", address->m_netMaskBitCount);
			}
		}

		printf("\n");
	}

	printf("%d adapters found\n", adapterList.getCount());
}